

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateFunctionDefinition(ExpressionEvalContext *ctx,ExprFunctionDefinition *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  FunctionData *pFVar4;
  TypeFunction *pTVar5;
  bool bVar6;
  int iVar7;
  StackFrame **ppSVar8;
  undefined4 extraout_var;
  undefined8 *puVar9;
  TypeRef *pTVar10;
  undefined4 extraout_var_01;
  ExprBase *pEVar11;
  undefined4 extraout_var_00;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar8 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar8)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar11 = (ExprBase *)CONCAT44(extraout_var,iVar7);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar11->typeID = 2;
    pEVar11->source = pSVar2;
    pEVar11->type = pTVar3;
    pEVar11->next = (ExprBase *)0x0;
    pEVar11->listed = false;
    pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
    return pEVar11;
  }
  bVar6 = AddInstruction(ctx);
  if (!bVar6) {
    return (ExprBase *)0x0;
  }
  pAVar1 = ctx->ctx->allocator;
  iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
  puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar7);
  pSVar2 = (expression->super_ExprBase).source;
  pTVar10 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
  *(undefined4 *)(puVar9 + 1) = 9;
  puVar9[2] = pSVar2;
  puVar9[3] = pTVar10;
  puVar9[4] = 0;
  *(undefined1 *)(puVar9 + 5) = 0;
  *puVar9 = &PTR__ExprBase_002405c0;
  pAVar1 = ctx->ctx->allocator;
  iVar7 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x40);
  pEVar11 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
  pSVar2 = (expression->super_ExprBase).source;
  pFVar4 = expression->function;
  pTVar5 = pFVar4->type;
  pEVar11->typeID = 0xb;
  pEVar11->source = pSVar2;
  pEVar11->type = &pTVar5->super_TypeBase;
  pEVar11->next = (ExprBase *)0x0;
  pEVar11->listed = false;
  pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002405f8;
  pEVar11[1]._vptr_ExprBase = (_func_int **)pFVar4;
  *(undefined8 **)&pEVar11[1].typeID = puVar9;
  pEVar11 = CheckType(&expression->super_ExprBase,pEVar11);
  return pEVar11;
}

Assistant:

ExprBase* EvaluateFunctionDefinition(ExpressionEvalContext &ctx, ExprFunctionDefinition *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

	return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->function->type, expression->function, context));
}